

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O3

void __thiscall
CTcHashEntryPpSpecial::CTcHashEntryPpSpecial
          (CTcHashEntryPpSpecial *this,CTcTokenizer *tok,char *str)

{
  undefined1 *puVar1;
  size_t len;
  
  len = strlen(str);
  CVmHashEntry::CVmHashEntry((CVmHashEntry *)this,str,len,0);
  puVar1 = &(this->super_CTcHashEntryPp).field_0x44;
  *puVar1 = *puVar1 & 0xfc;
  (this->super_CTcHashEntryPp).argc_ = 0;
  (this->super_CTcHashEntryPp).argv_ = (char **)0x0;
  (this->super_CTcHashEntryPp).params_table_ = (CVmHashTable *)0x0;
  (this->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__CVmHashEntry_0031cbf0;
  this->tok_ = tok;
  return;
}

Assistant:

CTcHashEntryPpSpecial(CTcTokenizer *tok, const char *str)
        : CTcHashEntryPp(str, strlen(str), FALSE)
    {
        /* remember my tokenizer */
        tok_ = tok;
    }